

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int * __thiscall ConvexDecomposition::Array<int>::Add(Array<int> *this,int t)

{
  int *piVar1;
  int iVar2;
  int s;
  
  iVar2 = this->count;
  if (iVar2 <= this->array_size) {
    if (iVar2 == this->array_size) {
      s = 0x10;
      if (iVar2 != 0) {
        s = iVar2 * 2;
      }
      allocate(this,s);
      iVar2 = this->count;
    }
    piVar1 = this->element;
    this->count = iVar2 + 1;
    piVar1[iVar2] = t;
    return piVar1 + (long)this->count + -1;
  }
  __assert_fail("count<=array_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5e8,"Type &ConvexDecomposition::Array<int>::Add(Type) [Type = int]");
}

Assistant:

Type& Array<Type>::Add(Type t)
{
	assert(count<=array_size);
	if(count==array_size)
	{
		allocate((array_size)?array_size *2:16);
	}
	element[count++] = t;
	return element[count-1];
}